

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

BasicResult<Catch::clara::detail::ParseState> *
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
ok<Catch::clara::detail::ParseState>(ParseState *value)

{
  ParseState *in_RSI;
  BasicResult<Catch::clara::detail::ParseState> *in_RDI;
  BasicResult<Catch::clara::detail::ParseState> *unaff_retaddr;
  
  ResultValueBase(unaff_retaddr,(Type)((ulong)in_RDI >> 0x20),in_RSI);
  return in_RDI;
}

Assistant:

static auto ok( U const &value ) -> BasicResult { return { ResultBase::Ok, value }; }